

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::ServiceOptions::~ServiceOptions(ServiceOptions *this)

{
  ServiceOptions *this_local;
  
  ~ServiceOptions(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

ServiceOptions::~ServiceOptions() {
  // @@protoc_insertion_point(destructor:google.protobuf.ServiceOptions)
  SharedDtor(*this);
}